

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  element_type *peVar1;
  ulong uVar2;
  bool bVar3;
  Shareability SVar4;
  HeapType HVar5;
  uint uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  HeapType local_60;
  shared_ptr<wasm::GCData> local_58;
  shared_ptr<wasm::GCData> local_48;
  shared_ptr<wasm::GCData> local_38;
  
  local_60 = wasm::Type::getHeapType(&this->type);
  SVar4 = HeapType::getShared(&local_60);
  bVar3 = wasm::Type::isSubType((Type)(this->type).id,(Type)((ulong)(SVar4 == Shared) * 4 + 10));
  if (!bVar3) {
    __assert_fail("Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0xb5b,"Literal wasm::Literal::internalize() const");
  }
  bVar3 = wasm::Type::isNull(&this->type);
  if (bVar3) {
    local_58.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Literal(__return_storage_ptr__,&local_58,(HeapType)((ulong)(SVar4 == Shared) * 4 + 0x58));
    this_00._M_pi =
         local_58.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    peVar1 = (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar2 = (peVar1->type).id;
    uVar6 = (uint)uVar2 & 0x7b;
    if (uVar6 == 0x30 && uVar2 < 0x7d) {
      HVar5 = wasm::Type::getHeapType
                        (&(peVar1->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                          type);
      if ((HVar5.id < 0x7d) && (((uint)HVar5.id & 0x7b) == 0x30)) {
        Literal(__return_storage_ptr__,
                (((this->field_0).gcData.
                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->values).
                super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        return __return_storage_ptr__;
      }
      __assert_fail("gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0xb60,"Literal wasm::Literal::internalize() const");
    }
    if (uVar6 == 0x50 && uVar2 < 0x7d) {
      local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      Literal(__return_storage_ptr__,&local_48,(HeapType)((ulong)(SVar4 == Shared) * 4 + 0x20));
      this_00._M_pi =
           local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      Literal(__return_storage_ptr__,&local_38,
              (HeapType)
              (((this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->type).id);
      this_00._M_pi =
           local_38.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::internalize() const {
  auto share = type.getHeapType().getShared();
  assert(
    Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) &&
    "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::none.getBasic(share));
  }
  if (gcData->type.isMaybeShared(HeapType::i31)) {
    assert(gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31));
    return gcData->values[0];
  }
  if (gcData->type.isMaybeShared(HeapType::string)) {
    // Strings turn into anyref literals.
    return Literal(gcData, HeapTypes::any.getBasic(share));
  }
  return Literal(gcData, gcData->type);
}